

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O1

void __thiscall
Function_Pool::OutputInfo::_getArray
          (OutputInfo *this,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *input,vector<unsigned_int,_std::allocator<unsigned_int>_> *output)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  pointer pvVar2;
  pointer puVar3;
  pointer puVar4;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  _Var5;
  imageException *this_00;
  ulong uVar6;
  ulong uVar7;
  pointer puVar8;
  pointer puVar9;
  
  pvVar1 = (input->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pvVar1 == (input->
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,"Output array is empty");
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(output,pvVar1);
    pvVar1 = (input->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>,__gnu_cxx::__ops::_Iter_pred<Function_Pool::OutputInfo::_getArray(std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>&,std::vector<unsigned_int,std::allocator<unsigned_int>>&)const::_lambda(std::vector<unsigned_int,std::allocator<unsigned_int>>&)_1_>>
                      ((input->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,pvVar1,output);
    if (_Var5._M_current == pvVar1) {
      pvVar2 = (input->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(input->
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
              -0x5555555555555555;
      if (1 < uVar6) {
        puVar3 = (output->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = 1;
        do {
          puVar4 = *(pointer *)
                    ((long)&pvVar2[uVar7].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data + 8);
          puVar9 = puVar3;
          for (puVar8 = pvVar2[uVar7].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start; puVar8 != puVar4; puVar8 = puVar8 + 1) {
            *puVar9 = *puVar9 + *puVar8;
            puVar9 = puVar9 + 1;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar6);
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::clear(input);
      return;
    }
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,"Returned histograms are not the same size");
  }
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void _getArray( std::vector < std::vector < uint32_t > > & input, std::vector < uint32_t > & output ) const
        {
            if( input.empty() )
                throw imageException( "Output array is empty" );

            output = input.front();

            if( std::any_of( input.begin(), input.end(), [&output]( std::vector <uint32_t> & v ) { return v.size() != output.size(); } ) )
                throw imageException( "Returned histograms are not the same size" );

            for( size_t i = 1; i < input.size(); ++i ) {
                std::vector < uint32_t >::iterator       out = output.begin();
                std::vector < uint32_t >::const_iterator in  = input[i].begin();
                std::vector < uint32_t >::const_iterator end = input[i].end();

                for( ; in != end; ++in, ++out )
                    *out += *in;
            }

            input.clear(); // to guarantee that no one can use it second time
        }